

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Loop.cpp
# Opt level: O3

void __thiscall net_uv::UVLoop::free_buf(UVLoop *this,uv_buf_t *buf)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  
  if (buf != (uv_buf_t *)0x0) {
    if (10 < (this->m_freeReadBufList).super__List_base<uv_buf_t,_std::allocator<uv_buf_t>_>._M_impl
             ._M_node._M_size) {
      free(buf->base);
      return;
    }
    p_Var3 = (_List_node_base *)operator_new(0x20);
    p_Var2 = (_List_node_base *)buf->len;
    p_Var3[1]._M_next = (_List_node_base *)buf->base;
    p_Var3[1]._M_prev = p_Var2;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(this->m_freeReadBufList).super__List_base<uv_buf_t,_std::allocator<uv_buf_t>_>.
              _M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  return;
}

Assistant:

void UVLoop::free_buf(const uv_buf_t* buf)
{
	if (buf == NULL)
	{
		return;
	}

	if (m_freeReadBufList.size() > 10)
	{
		fc_free(buf->base);
		return;
	}

	m_freeReadBufList.push_back(*buf);
}